

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

void Extra_SymmPairsPrint(Extra_SymmInfo_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int k;
  int i;
  Extra_SymmInfo_t *p_local;
  
  printf("\n");
  for (local_14 = 0; local_14 < p->nVars; local_14 = local_14 + 1) {
    for (local_18 = 0; iVar1 = local_14, local_18 <= local_14; local_18 = local_18 + 1) {
      printf(" ");
    }
    while (local_18 = iVar1 + 1, local_18 < p->nVars) {
      iVar1 = local_18;
      if (p->pSymms[local_14][local_18] == '\0') {
        printf(".");
      }
      else {
        printf("1");
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Extra_SymmPairsPrint( Extra_SymmInfo_t * p )
{
    int i, k;
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < p->nVars; k++ )
            if ( p->pSymms[i][k] )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}